

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::ImageLayoutBindingCase::buildLayout
          (String *__return_storage_ptr__,ImageLayoutBindingCase *this,String *binding)

{
  ostream *poVar1;
  ostringstream *this_00;
  char *pcVar2;
  ostringstream s;
  ostream local_190;
  
  this_00 = (ostringstream *)&local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if (binding->_M_string_length == 0) {
    pcVar2 = "layout(rgba8) readonly ";
  }
  else {
    poVar1 = std::operator<<(&local_190,"layout(binding=");
    this_00 = (ostringstream *)std::operator<<(poVar1,(string *)binding);
    pcVar2 = ", rgba8) readonly ";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ", rgba8) readonly ";
		else
			s << "layout(rgba8) readonly ";
		return s.str();
	}